

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unicodeOpen(sqlite3_tokenizer *p,char *aInput,int nInput,sqlite3_tokenizer_cursor **pp)

{
  void *__s;
  size_t sVar1;
  undefined8 *in_RCX;
  int in_EDX;
  char *in_RSI;
  unicode_cursor *pCsr;
  int in_stack_ffffffffffffffcc;
  undefined4 local_4;
  
  __s = sqlite3_malloc(in_stack_ffffffffffffffcc);
  if (__s == (void *)0x0) {
    local_4 = 7;
  }
  else {
    memset(__s,0,0x30);
    *(char **)((long)__s + 8) = in_RSI;
    if (in_RSI == (char *)0x0) {
      *(undefined4 *)((long)__s + 0x10) = 0;
    }
    else if (in_EDX < 0) {
      sVar1 = strlen(in_RSI);
      *(int *)((long)__s + 0x10) = (int)sVar1;
    }
    else {
      *(int *)((long)__s + 0x10) = in_EDX;
    }
    *in_RCX = __s;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int unicodeOpen(
  sqlite3_tokenizer *p,           /* The tokenizer */
  const char *aInput,             /* Input string */
  int nInput,                     /* Size of string aInput in bytes */
  sqlite3_tokenizer_cursor **pp   /* OUT: New cursor object */
){
  unicode_cursor *pCsr;

  pCsr = (unicode_cursor *)sqlite3_malloc(sizeof(unicode_cursor));
  if( pCsr==0 ){
    return SQLITE_NOMEM;
  }
  memset(pCsr, 0, sizeof(unicode_cursor));

  pCsr->aInput = (const unsigned char *)aInput;
  if( aInput==0 ){
    pCsr->nInput = 0;
  }else if( nInput<0 ){
    pCsr->nInput = (int)strlen(aInput);
  }else{
    pCsr->nInput = nInput;
  }

  *pp = &pCsr->base;
  UNUSED_PARAMETER(p);
  return SQLITE_OK;
}